

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

WasmOp __thiscall
Wasm::WasmBinaryReader::ReadPrefixedOpCode
          (WasmBinaryReader *this,WasmOp prefix,bool isSupported,char16 *notSupportedMsg)

{
  byte *pbVar1;
  char16 *notSupportedMsg_local;
  bool isSupported_local;
  WasmOp prefix_local;
  WasmBinaryReader *this_local;
  
  if (!isSupported) {
    ThrowDecodingError(this,notSupportedMsg);
  }
  CheckBytesLeft(this,1);
  (this->m_funcState).count = (this->m_funcState).count + 1;
  pbVar1 = this->m_pc;
  this->m_pc = pbVar1 + 1;
  return prefix << 8 | (ushort)*pbVar1;
}

Assistant:

WasmOp WasmBinaryReader::ReadPrefixedOpCode(WasmOp prefix, bool isSupported, const char16* notSupportedMsg)
{
    CompileAssert(sizeof(WasmOp) >= 2);
    if (!isSupported)
    {
        ThrowDecodingError(notSupportedMsg);
    }
    CheckBytesLeft(1);
    ++m_funcState.count;
    return (WasmOp)((prefix << 8) | (*m_pc++));
}